

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int32 pare_tree(node *sroot,int32 npermute,int32 **lists,int32 *llist)

{
  node *pnVar1;
  node_str *pnVar2;
  uint uVar3;
  node **idlist;
  void *ptr;
  int *ptr_00;
  float *ptr_01;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  size_t n_elem;
  float fVar9;
  
  idlist = (node **)__ckd_calloc__(0x400,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                   ,0x20e);
  uVar8 = 0;
  uVar3 = id_nodes(sroot,idlist,0);
  n_elem = (size_t)(int)uVar3;
  ptr = __ckd_calloc__(n_elem,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                       ,0x213);
  ptr_00 = (int *)__ckd_calloc__(n_elem,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x214);
  ptr_01 = (float *)__ckd_calloc__(n_elem,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                   ,0x215);
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar4 = 0;
    uVar6 = 0;
    uVar8 = 0;
    do {
      pnVar1 = idlist[uVar4];
      if (pnVar1 != (node *)0x0) {
        if ((pnVar1->left == (node_str *)0x0) && (pnVar1->right == (node_str *)0x0)) {
          lVar5 = (long)(int)uVar6;
          uVar6 = uVar6 + 1;
          *(int *)((long)ptr + lVar5 * 4) = (int)uVar4;
        }
        else if (((pnVar1 != (node *)0x0) &&
                 (((pnVar2 = pnVar1->left, pnVar2 != (node_str *)0x0 &&
                   (pnVar2->left == (node_str *)0x0)) && (pnVar2->right == (node_str *)0x0)))) &&
                (((pnVar2 = pnVar1->right, pnVar2 != (node_str *)0x0 &&
                  (pnVar2->left == (node_str *)0x0)) && (pnVar2->right == (node_str *)0x0)))) {
          iVar7 = (int)uVar8;
          ptr_00[iVar7] = (int)uVar4;
          uVar8 = (ulong)(iVar7 + 1);
          ptr_01[iVar7] = (float)pnVar1->lkhd_dec;
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  while (npermute < (int)uVar6) {
    iVar7 = *ptr_00;
    if (1 < (int)uVar8) {
      fVar9 = *ptr_01;
      uVar4 = 1;
      do {
        if (fVar9 < ptr_01[uVar4]) {
          iVar7 = ptr_00[uVar4];
          fVar9 = ptr_01[uVar4];
        }
        uVar4 = uVar4 + 1;
      } while (uVar8 != uVar4);
    }
    uVar8 = 0;
    idlist[idlist[iVar7]->left->id] = (node *)0x0;
    idlist[idlist[iVar7]->right->id] = (node *)0x0;
    free_tree(idlist[iVar7]->left);
    free_tree(idlist[iVar7]->right);
    idlist[iVar7]->right = (node_str *)0x0;
    idlist[iVar7]->left = (node_str *)0x0;
    uVar6 = 0;
    if (0 < (int)uVar3) {
      uVar4 = 0;
      uVar8 = 0;
      do {
        pnVar1 = idlist[uVar4];
        if (pnVar1 != (node *)0x0) {
          if ((pnVar1->left == (node_str *)0x0) && (pnVar1->right == (node_str *)0x0)) {
            lVar5 = (long)(int)uVar6;
            uVar6 = uVar6 + 1;
            *(int *)((long)ptr + lVar5 * 4) = (int)uVar4;
          }
          else if (((pnVar1 != (node *)0x0) &&
                   ((((pnVar2 = pnVar1->left, pnVar2 != (node_str *)0x0 &&
                      (pnVar2->left == (node_str *)0x0)) && (pnVar2->right == (node_str *)0x0)) &&
                    ((pnVar2 = pnVar1->right, pnVar2 != (node_str *)0x0 &&
                     (pnVar2->left == (node_str *)0x0)))))) && (pnVar2->right == (node_str *)0x0)) {
            iVar7 = (int)uVar8;
            ptr_00[iVar7] = (int)uVar4;
            uVar8 = (ulong)(iVar7 + 1);
            ptr_01[iVar7] = (float)pnVar1->lkhd_dec;
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
  }
  if (0 < (int)uVar6) {
    uVar8 = 0;
    do {
      iVar7 = idlist[*(int *)((long)ptr + uVar8 * 4)]->nphones;
      llist[uVar8] = iVar7;
      memcpy(lists[uVar8],idlist[*(int *)((long)ptr + uVar8 * 4)]->phoneids,(long)iVar7 << 2);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  ckd_free(idlist);
  ckd_free(ptr);
  ckd_free(ptr_00);
  ckd_free(ptr_01);
  return uVar6;
}

Assistant:

int32 pare_tree(node *sroot, int32 npermute, int32 **lists, int32 *llist)
{
    float32 *twiglkhddec,maxdec;
    int32  *leaflist, nleaves, *twiglist, ntwigs;
    int32  nnodes,i,maxid;
    node   **idlist;

    /* Overallocate idlist */
    idlist = (node **) ckd_calloc(1024,sizeof(node *));
    /* First "id" all the nodes */
    nnodes = id_nodes(sroot,idlist,0);

    /* Allocate lists (overallocate for safety margin) */
    leaflist = (int32 *) ckd_calloc(nnodes,sizeof(int32));
    twiglist = (int32 *) ckd_calloc(nnodes,sizeof(int32));
    twiglkhddec = (float32 *) ckd_calloc(nnodes,sizeof(float32));

    nleaves = ntwigs = 0;
    for(i=0;i<nnodes;i++) {
        if (IS_LEAF(idlist[i])) leaflist[nleaves++] = i;
        else if (IS_TWIG(idlist[i])) {
            twiglist[ntwigs] = i;
            twiglkhddec[ntwigs++] = (idlist[i])->lkhd_dec;
        }
    }

    while (nleaves > npermute) {
        /* find twig for which likelihood decerase was maximum 
         * this is the worst merge */
        maxdec = twiglkhddec[0]; maxid = twiglist[0];
        for (i=1; i<ntwigs;i++) {
            if (twiglkhddec[i] > maxdec) {
                maxdec = twiglkhddec[i];
                maxid = twiglist[i];
            }
        }
        /* remove children of twig, make twig a leaf, eliminate if from
           the node list, and continue */
        idlist[idlist[maxid]->left->id] = NULL;
        idlist[idlist[maxid]->right->id] = NULL;
        free_tree(idlist[maxid]->left); free_tree(idlist[maxid]->right);
        idlist[maxid]->left = idlist[maxid]->right = NULL;

        nleaves = ntwigs = 0;
        for(i=0;i<nnodes;i++) {
            if (IS_LEAF(idlist[i])) leaflist[nleaves++] = i;
            else if (IS_TWIG(idlist[i])) {
                twiglist[ntwigs] = i;
                twiglkhddec[ntwigs++] = (idlist[i])->lkhd_dec;
            }
        }
    }
    for (i=0;i<nleaves;i++) {
        llist[i] = idlist[leaflist[i]]->nphones;
        memcpy(lists[i],idlist[leaflist[i]]->phoneids,sizeof(int32)*llist[i]);
    }
    ckd_free(idlist); ckd_free(leaflist);
    ckd_free(twiglist); ckd_free(twiglkhddec);

    return(nleaves);
}